

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

FT_Error af_axis_hints_new_edge
                   (AF_AxisHints axis,FT_Int fpos,AF_Direction dir,FT_Bool top_to_bottom_hinting,
                   FT_Memory memory,AF_Edge_conflict *anedge)

{
  uint uVar1;
  AF_Edge_conflict pAVar2;
  uint local_50;
  FT_UInt big_max;
  FT_UInt new_max;
  FT_UInt old_max;
  AF_Edge_conflict edges;
  AF_Edge_conflict edge;
  AF_Edge_conflict *ppAStack_30;
  FT_Error error;
  AF_Edge_conflict *anedge_local;
  FT_Memory memory_local;
  AF_Direction local_18;
  FT_Int FStack_14;
  FT_Bool top_to_bottom_hinting_local;
  AF_Direction dir_local;
  FT_Int fpos_local;
  AF_AxisHints axis_local;
  
  edge._4_4_ = 0;
  edges = (AF_Edge_conflict)0x0;
  ppAStack_30 = anedge;
  anedge_local = (AF_Edge_conflict *)memory;
  memory_local._7_1_ = top_to_bottom_hinting;
  local_18 = dir;
  FStack_14 = fpos;
  _dir_local = axis;
  if (axis->num_edges < 0xc) {
    if (axis->edges == (AF_Edge_conflict)0x0) {
      axis->edges = (axis->embedded).edges;
      axis->max_edges = 0xc;
    }
  }
  else if (axis->max_edges <= axis->num_edges) {
    uVar1 = axis->max_edges;
    if (0x1745d16 < uVar1) {
      edge._4_4_ = 0x40;
      goto LAB_0036f059;
    }
    local_50 = (uVar1 >> 2) + 4 + uVar1;
    if ((local_50 < uVar1) || (0x1745d17 < local_50)) {
      local_50 = 0x1745d17;
    }
    if (axis->edges == (axis->embedded).edges) {
      pAVar2 = (AF_Edge_conflict)
               ft_mem_realloc(memory,0x58,0,(ulong)local_50,(void *)0x0,
                              (FT_Error *)((long)&edge + 4));
      _dir_local->edges = pAVar2;
      if (edge._4_4_ != 0) goto LAB_0036f059;
      memcpy(_dir_local->edges,(_dir_local->embedded).edges,0x420);
    }
    else {
      pAVar2 = (AF_Edge_conflict)
               ft_mem_realloc(memory,0x58,(ulong)uVar1,(ulong)local_50,axis->edges,
                              (FT_Error *)((long)&edge + 4));
      _dir_local->edges = pAVar2;
      if (edge._4_4_ != 0) goto LAB_0036f059;
    }
    _dir_local->max_edges = local_50;
  }
  pAVar2 = _dir_local->edges;
  for (edges = pAVar2 + _dir_local->num_edges; pAVar2 < edges; edges = edges + -1) {
    if (memory_local._7_1_ == '\0') {
      if (edges[-1].fpos < FStack_14) break;
    }
    else if (FStack_14 < edges[-1].fpos) break;
    if ((edges[-1].fpos == FStack_14) && (local_18 == _dir_local->major_dir)) break;
    memcpy(edges,edges + -1,0x58);
  }
  _dir_local->num_edges = _dir_local->num_edges + 1;
LAB_0036f059:
  *ppAStack_30 = edges;
  return edge._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_axis_hints_new_edge( AF_AxisHints  axis,
                          FT_Int        fpos,
                          AF_Direction  dir,
                          FT_Bool       top_to_bottom_hinting,
                          FT_Memory     memory,
                          AF_Edge      *anedge )
  {
    FT_Error  error = FT_Err_Ok;
    AF_Edge   edge  = NULL;
    AF_Edge   edges;


    if ( axis->num_edges < AF_EDGES_EMBEDDED )
    {
      if ( !axis->edges )
      {
        axis->edges     = axis->embedded.edges;
        axis->max_edges = AF_EDGES_EMBEDDED;
      }
    }
    else if ( axis->num_edges >= axis->max_edges )
    {
      FT_UInt  old_max = axis->max_edges;
      FT_UInt  new_max = old_max;
      FT_UInt  big_max = FT_INT_MAX / sizeof ( *edge );


      if ( old_max >= big_max )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }

      new_max += ( new_max >> 2 ) + 4;
      if ( new_max < old_max || new_max > big_max )
        new_max = big_max;

      if ( axis->edges == axis->embedded.edges )
      {
        if ( FT_NEW_ARRAY( axis->edges, new_max ) )
          goto Exit;
        ft_memcpy( axis->edges, axis->embedded.edges,
                   sizeof ( axis->embedded.edges ) );
      }
      else
      {
        if ( FT_RENEW_ARRAY( axis->edges, old_max, new_max ) )
          goto Exit;
      }

      axis->max_edges = new_max;
    }

    edges = axis->edges;
    edge  = edges + axis->num_edges;

    while ( edge > edges )
    {
      if ( top_to_bottom_hinting ? ( edge[-1].fpos > fpos )
                                 : ( edge[-1].fpos < fpos ) )
        break;

      /* we want the edge with same position and minor direction */
      /* to appear before those in the major one in the list     */
      if ( edge[-1].fpos == fpos && dir == axis->major_dir )
        break;

      edge[0] = edge[-1];
      edge--;
    }

    axis->num_edges++;

  Exit:
    *anedge = edge;
    return error;
  }